

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
StatisticsWriter::writeMatrix<double>
          (StatisticsWriter *this,ostream *stream,MultivariateTracker *tracker,string *title,
          offset_in_MultivariateTracker_to_subr matrix)

{
  long lVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  ostream *poVar5;
  code *pcVar6;
  pointer plVar7;
  long lVar8;
  long in_R9;
  long i;
  size_type __n;
  long j;
  size_type sVar9;
  size_type sVar10;
  ulong uVar11;
  long *plVar12;
  double dVar13;
  vector<long,_std::allocator<long>_> width;
  string indent;
  string header;
  string footer;
  string local_70;
  string local_50;
  
  iVar2 = (int)(((long)(tracker->_statistics).
                       super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(tracker->_statistics).
                      super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0xe8);
  __n = (size_type)iVar2;
  header._M_dataplus._M_p = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector
            (&width,__n,(value_type_conflict2 *)&header,(allocator_type *)&footer);
  lVar8 = 0;
  sVar3 = 0;
  if (0 < (long)__n) {
    sVar3 = __n;
  }
  for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
    MultivariateTracker::getName_abi_cxx11_(&local_50,tracker,sVar9);
    StringParser::updateWidthString
              (&local_50,
               (long *)((long)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar8));
    std::__cxx11::string::~string((string *)&local_50);
    lVar8 = lVar8 + 8;
  }
  plVar12 = (long *)((long)&(tracker->_covariance).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + in_R9);
  for (sVar9 = 0; sVar9 != sVar3; sVar9 = sVar9 + 1) {
    lVar8 = 0;
    for (sVar10 = 0; __n != sVar10; sVar10 = sVar10 + 1) {
      pcVar6 = (code *)matrix;
      if ((matrix & 1) != 0) {
        pcVar6 = *(code **)(*plVar12 + -1 + matrix);
      }
      dVar13 = (double)(*pcVar6)(plVar12,sVar9,sVar10);
      StringParser::updateWidthNumber<double>
                (dVar13,(long *)((long)width.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                       .super__Vector_impl_data._M_start + lVar8));
      lVar8 = lVar8 + 8;
    }
  }
  uVar4 = 0;
  for (plVar7 = width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar7 != width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish; plVar7 = plVar7 + 1) {
    lVar8 = *plVar7;
    *plVar7 = lVar8 + 3;
    uVar4 = uVar4 + lVar8 + 3;
  }
  uVar11 = 0x14;
  if (0x14 < (long)uVar4) {
    uVar11 = uVar4;
  }
  header._M_dataplus._M_p = (pointer)&header.field_2;
  std::__cxx11::string::_M_construct((string *)&header,uVar11,'=');
  footer._M_dataplus._M_p = (pointer)&footer.field_2;
  std::__cxx11::string::_M_construct((string *)&footer,uVar11,'-');
  poVar5 = std::operator<<((ostream *)stream,(string *)this);
  poVar5 = std::operator<<(poVar5,(string *)&header);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)stream,(string *)this);
  poVar5 = std::operator<<(poVar5,0x20);
  *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = (long)(int)(uVar11 >> 1);
  poVar5 = std::operator<<(poVar5,(string *)title);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)stream,(string *)this);
  poVar5 = std::operator<<(poVar5,(string *)&header);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)stream,(string *)this);
  if (iVar2 == 0) {
    poVar5 = std::operator<<((ostream *)stream,"No Data");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
      lVar8 = *(long *)stream;
      lVar1 = *(long *)(lVar8 + -0x18);
      *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(stream + *(long *)(lVar8 + -0x18) + 0x10) =
           (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar9];
      MultivariateTracker::getName_abi_cxx11_(&indent,tracker,sVar9);
      std::operator<<((ostream *)stream,(string *)&indent);
      std::__cxx11::string::~string((string *)&indent);
    }
    std::endl<char,std::char_traits<char>>((ostream *)stream);
    poVar5 = std::operator<<((ostream *)stream,(string *)this);
    poVar5 = std::operator<<(poVar5,(string *)&footer);
    std::endl<char,std::char_traits<char>>(poVar5);
    indent._M_dataplus._M_p = (pointer)&indent.field_2;
    std::__cxx11::string::_M_construct((string *)&indent,(this->_comment)._M_string_length,' ');
    for (sVar9 = 0; sVar9 != sVar3; sVar9 = sVar9 + 1) {
      std::operator<<((ostream *)stream,(string *)&indent);
      for (sVar10 = 0; __n != sVar10; sVar10 = sVar10 + 1) {
        lVar8 = *(long *)stream;
        lVar1 = *(long *)(lVar8 + -0x18);
        *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
        *(long *)(stream + *(long *)(lVar8 + -0x18) + 0x10) =
             (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar10];
        pcVar6 = (code *)matrix;
        if ((matrix & 1) != 0) {
          pcVar6 = *(code **)(*plVar12 + -1 + matrix);
        }
        dVar13 = (double)(*pcVar6)(plVar12,sVar9,sVar10);
        StringParser::parseNumber<double>(&local_70,dVar13,false);
        std::operator<<((ostream *)stream,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::endl<char,std::char_traits<char>>((ostream *)stream);
    }
    std::endl<char,std::char_traits<char>>((ostream *)stream);
    std::__cxx11::string::~string((string *)&indent);
  }
  std::__cxx11::string::~string((string *)&footer);
  std::__cxx11::string::~string((string *)&header);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&width.super__Vector_base<long,_std::allocator<long>_>);
  return;
}

Assistant:

void
    writeMatrix(std::ostream & stream,
                MultivariateTracker & tracker,
                std::string const & title,
                T (MultivariateTracker::*matrix)(long const i, long const j) const)
    {

        int numDim = tracker.getDimension();

        // Compute column widths
        std::vector<long> width(numDim,0);
        for (long i = 0; i < numDim; i++)
        {
            StringParser::updateWidthString(tracker.getName(i), width[i]);
        }
        for (long i = 0; i < numDim; i++)
        {
            for (long j = 0; j < numDim; j++)
            {
                StringParser::updateWidthNumber<T>((tracker.*matrix)(i,j), width[j]);
            }
        }

        long totalWidth = 0;
        for (std::vector<long>::iterator it = width.begin(); it != width.end(); ++it)
        {
            (*it) += 3;
            totalWidth += *it;
        }
        totalWidth = std::max<long>(totalWidth, 20);

        // Print data headers
        std::string header(totalWidth,'='); 
        std::string footer(totalWidth,'-'); 
        stream << this->_comment << header << std::endl;
        stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << title << std::endl;
        stream << this->_comment << header << std::endl;
        stream << this->_comment;
        if (numDim == 0)
        {
            stream << "No Data" << std::endl;
            return;
        }
        for (long i = 0; i < numDim; i++)
        {
            stream << std::right << std::setw(width[i]) << tracker.getName(i);
        }
        stream << std::endl;
        stream << this->_comment << footer << std::endl;

        // Print data
        std::string indent(this->_comment.size(),' '); 
        for (long i = 0; i < numDim; i++)
        {
            stream << indent;
            for (long j = 0; j < numDim; j++)
            {
                stream << std::right << std::setw(width[j]) << StringParser::parseNumber<T>((tracker.*matrix)(i,j));
            }
            stream << std::endl;
        }
        stream << std::endl;
    
        return;
        
    }